

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O3

uint64_t sum_quotients_vec<unsigned_short,libdivide::divider<unsigned_short,(libdivide::Branching)1>>
                   (random_numerators<unsigned_short> *vals,
                   divider<unsigned_short,_(libdivide::Branching)1> *div)

{
  uint32_t *puVar1;
  byte bVar2;
  size_t i;
  uint32_t *puVar3;
  UIntT sum;
  ushort uVar4;
  uint32_t yl;
  long lVar5;
  uint32_t xl;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [64];
  type_pun_vec result;
  undefined1 local_100 [64];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  if ((ulong)vals->_length == 0) {
    auVar8 = ZEXT1664((undefined1  [16])0x0);
  }
  else {
    puVar3 = vals->_pData;
    uVar4 = (div->div).denom.magic;
    bVar2 = (div->div).denom.more;
    auVar8 = ZEXT1664((undefined1  [16])0x0);
    puVar1 = (uint32_t *)((long)puVar3 + (ulong)vals->_length * 2);
    do {
      lVar5 = 0;
      local_c0 = *(undefined8 *)puVar3;
      uStack_b8 = *(undefined8 *)(puVar3 + 2);
      uStack_b0 = *(undefined8 *)(puVar3 + 4);
      uStack_a8 = *(undefined8 *)(puVar3 + 6);
      uStack_a0 = *(undefined8 *)(puVar3 + 8);
      uStack_98 = *(undefined8 *)(puVar3 + 10);
      uStack_90 = *(undefined8 *)(puVar3 + 0xc);
      uStack_88 = *(undefined8 *)(puVar3 + 0xe);
      do {
        uVar6 = (uint)*(ushort *)((long)&local_c0 + lVar5 * 2);
        uVar7 = uVar4 * uVar6 >> 0x10;
        *(short *)(local_100 + lVar5 * 2) =
             (short)(((uVar6 - uVar7 >> 1) + uVar7 & 0xffff) >> (bVar2 & 0x1f));
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x20);
      auVar8 = vpaddw_avx512bw(auVar8,local_100);
      puVar3 = puVar3 + 0x10;
    } while (puVar3 != puVar1);
  }
  local_100 = vmovdqa64_avx512f(auVar8);
  lVar5 = 0;
  uVar4 = 0;
  do {
    uVar4 = uVar4 + *(short *)(local_100 + lVar5 * 2);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x20);
  return (ulong)uVar4;
}

Assistant:

NOINLINE uint64_t sum_quotients_vec(const random_numerators<IntT> &vals, const Divisor &div) {
    size_t count = sizeof(x86_VECTOR_TYPE) / sizeof(IntT);
    x86_VECTOR_TYPE sumX4 = SETZERO_SI();
    for (auto iter = vals.begin(); iter != vals.end(); iter += count) {
        x86_VECTOR_TYPE numers = LOAD_SI((const x86_VECTOR_TYPE *)iter);
        numers = numers / div;
        sumX4 = add_vector<sizeof(IntT)>(sumX4, numers);
    }
    return unsigned_sum_vals((const IntT *)&sumX4, count);
}